

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExact.c
# Opt level: O2

Abc_Obj_t *
Abc_ExactBuildNode(word *pTruth,int nVars,int *pArrTimeProfile,Abc_Obj_t **pFanins,Abc_Ntk_t *pNtk)

{
  byte *pbVar1;
  byte bVar2;
  char *pcVar3;
  Abc_Ntk_t *pAVar4;
  int iVar5;
  uint uVar6;
  abctime aVar7;
  Abc_Obj_t *pAVar8;
  ulong uVar9;
  Vec_Ptr_t *p;
  long lVar10;
  char *pName;
  char *pcVar11;
  Abc_Obj_t *pAVar12;
  uint uVar13;
  ulong uVar14;
  byte *pbVar15;
  char pGateTruth [5];
  char *pSol;
  int nMaxArrival;
  int pNormalArrTime [8];
  byte local_89 [5];
  int local_84;
  abctime local_80;
  char *local_78;
  Abc_Ntk_t *local_70;
  ulong local_68;
  int local_5c;
  int local_58 [10];
  
  local_78 = (char *)0x0;
  local_80 = Abc_Clock();
  if (nVars == 0) {
    aVar7 = Abc_Clock();
    s_pSesStore->timeTotal = s_pSesStore->timeTotal + (aVar7 - local_80);
    if ((*pTruth & 1) == 0) {
      pAVar8 = Abc_NtkCreateNodeConst0(pNtk);
      return pAVar8;
    }
    pAVar8 = Abc_NtkCreateNodeConst1(pNtk);
    return pAVar8;
  }
  if (nVars == 1) {
    aVar7 = Abc_Clock();
    s_pSesStore->timeTotal = s_pSesStore->timeTotal + (aVar7 - local_80);
    if ((*pTruth & 1) == 0) {
      pAVar8 = Abc_NtkCreateNodeBuf(pNtk,*pFanins);
      return pAVar8;
    }
    pAVar8 = Abc_NtkCreateNodeInv(pNtk,*pFanins);
    return pAVar8;
  }
  uVar9 = 0;
  uVar14 = 0;
  if (0 < nVars) {
    uVar14 = (ulong)(uint)nVars;
  }
  for (; uVar14 != uVar9; uVar9 = uVar9 + 1) {
    local_58[uVar9] = pArrTimeProfile[uVar9];
  }
  Abc_NormalizeArrivalTimes(local_58,nVars,&local_5c);
  local_84 = nVars;
  iVar5 = Ses_StoreGetEntry(s_pSesStore,pTruth,nVars,local_58,&local_78);
  pcVar3 = local_78;
  if (iVar5 == 0) {
    __assert_fail("Ses_StoreGetEntry( s_pSesStore, pTruth, nVars, pNormalArrTime, &pSol )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcExact.c"
                  ,0xb68,
                  "Abc_Obj_t *Abc_ExactBuildNode(word *, int, int *, Abc_Obj_t **, Abc_Ntk_t *)");
  }
  if (local_78 == (char *)0x0) {
    aVar7 = Abc_Clock();
    s_pSesStore->timeTotal = s_pSesStore->timeTotal + (aVar7 - local_80);
    pAVar8 = (Abc_Obj_t *)0x0;
  }
  else {
    if (*local_78 != local_84) {
      __assert_fail("pSol[ABC_EXACT_SOL_NVARS] == nVars",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcExact.c"
                    ,0xb6f,
                    "Abc_Obj_t *Abc_ExactBuildNode(word *, int, int *, Abc_Obj_t **, Abc_Ntk_t *)");
    }
    if (local_78[1] != '\x01') {
      __assert_fail("pSol[ABC_EXACT_SOL_NFUNC] == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcExact.c"
                    ,0xb70,
                    "Abc_Obj_t *Abc_ExactBuildNode(word *, int, int *, Abc_Obj_t **, Abc_Ntk_t *)");
    }
    p = Vec_PtrAlloc(local_78[2] + local_84);
    local_89[3] = 0x30;
    local_89[4] = 0;
    for (uVar9 = 0; uVar14 != uVar9; uVar9 = uVar9 + 1) {
      if (pFanins[uVar9] == (Abc_Obj_t *)0x0) {
        __assert_fail("pFanins[i]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcExact.c"
                      ,0xb79,
                      "Abc_Obj_t *Abc_ExactBuildNode(word *, int, int *, Abc_Obj_t **, Abc_Ntk_t *)"
                     );
      }
      Vec_PtrPush(p,pFanins[uVar9]);
    }
    pbVar15 = (byte *)(pcVar3 + 3);
    uVar9 = 0;
    local_70 = pNtk;
    while( true ) {
      uVar6 = (uint)pcVar3[2];
      bVar2 = *pbVar15;
      if ((int)uVar6 <= (int)uVar9) break;
      local_89[2] = bVar2 & 1 | 0x30;
      local_89[1] = bVar2 >> 1 & 1 | 0x30;
      local_89[0] = bVar2 >> 2 & 1 | 0x30;
      if (pbVar15[1] != 2) {
        __assert_fail("*p == 2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcExact.c"
                      ,0xb86,
                      "Abc_Obj_t *Abc_ExactBuildNode(word *, int, int *, Abc_Obj_t **, Abc_Ntk_t *)"
                     );
      }
      uVar13 = (int)uVar9 + 1;
      if (uVar13 == uVar6) {
        iVar5 = Abc_LitIsCompl((int)(char)pbVar15[4]);
        if (iVar5 != 0) {
          for (lVar10 = 0; lVar10 != 4; lVar10 = lVar10 + 1) {
            local_89[lVar10] = local_89[lVar10] == 0x30 | 0x30;
          }
        }
      }
      local_68 = (ulong)uVar13;
      pName = Abc_SopFromTruthBin((char *)local_89);
      pAVar4 = local_70;
      pAVar8 = Abc_NtkCreateNode(local_70);
      if (pAVar8 == (Abc_Obj_t *)0x0) {
        __assert_fail("pObj",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcExact.c"
                      ,0xb90,
                      "Abc_Obj_t *Abc_ExactBuildNode(word *, int, int *, Abc_Obj_t **, Abc_Ntk_t *)"
                     );
      }
      pcVar11 = Abc_SopRegister((Mem_Flex_t *)pAVar4->pManFunc,pName);
      (pAVar8->field_5).pData = pcVar11;
      Vec_PtrPush(p,pAVar8);
      free(pName);
      pAVar12 = (Abc_Obj_t *)Vec_PtrEntry(p,(int)(char)pbVar15[2]);
      Abc_ObjAddFanin(pAVar8,pAVar12);
      pbVar1 = pbVar15 + 3;
      pbVar15 = pbVar15 + 4;
      pAVar12 = (Abc_Obj_t *)Vec_PtrEntry(p,(int)(char)*pbVar1);
      Abc_ObjAddFanin(pAVar8,pAVar12);
      uVar9 = local_68;
    }
    iVar5 = Abc_Lit2Var((int)(char)bVar2);
    pAVar8 = (Abc_Obj_t *)Vec_PtrEntry(p,local_84 + iVar5);
    Vec_PtrFree(p);
    aVar7 = Abc_Clock();
    s_pSesStore->timeTotal = s_pSesStore->timeTotal + (aVar7 - local_80);
  }
  return pAVar8;
}

Assistant:

Abc_Obj_t * Abc_ExactBuildNode( word * pTruth, int nVars, int * pArrTimeProfile, Abc_Obj_t ** pFanins, Abc_Ntk_t * pNtk )
{
    char * pSol = NULL;
    int i, j, nMaxArrival;
    int pNormalArrTime[8];
    char const * p;
    Abc_Obj_t * pObj;
    Vec_Ptr_t * pGates;
    char pGateTruth[5];
    char * pSopCover;
    abctime timeStart = Abc_Clock();

    if ( nVars == 0 )
    {
        s_pSesStore->timeTotal += ( Abc_Clock() - timeStart );
        return (pTruth[0] & 1) ? Abc_NtkCreateNodeConst1(pNtk) : Abc_NtkCreateNodeConst0(pNtk);
    }
    if ( nVars == 1 )
    {
        s_pSesStore->timeTotal += ( Abc_Clock() - timeStart );
        return (pTruth[0] & 1) ? Abc_NtkCreateNodeInv(pNtk, pFanins[0]) : Abc_NtkCreateNodeBuf(pNtk, pFanins[0]);
    }

    for ( i = 0; i < nVars; ++i )
        pNormalArrTime[i] = pArrTimeProfile[i];
    Abc_NormalizeArrivalTimes( pNormalArrTime, nVars, &nMaxArrival );
    assert( Ses_StoreGetEntry( s_pSesStore, pTruth, nVars, pNormalArrTime, &pSol ) );
    if ( !pSol )
    {
        s_pSesStore->timeTotal += ( Abc_Clock() - timeStart );
        return NULL;
    }

    assert( pSol[ABC_EXACT_SOL_NVARS] == nVars );
    assert( pSol[ABC_EXACT_SOL_NFUNC] == 1 );

    pGates = Vec_PtrAlloc( nVars + pSol[ABC_EXACT_SOL_NGATES] );
    pGateTruth[3] = '0';
    pGateTruth[4] = '\0';

    /* primary inputs */
    for ( i = 0; i < nVars; ++i )
    {
        assert( pFanins[i] );
        Vec_PtrPush( pGates, pFanins[i] );
    }

    /* gates */
    p = pSol + 3;
    for ( i = 0; i < pSol[ABC_EXACT_SOL_NGATES]; ++i )
    {
        pGateTruth[2] = '0' + ( *p & 1 );
        pGateTruth[1] = '0' + ( ( *p >> 1 ) & 1 );
        pGateTruth[0] = '0' + ( ( *p >> 2 ) & 1 );
        ++p;

        assert( *p == 2 ); /* binary gate */
        ++p;

        /* invert truth table if we are last gate and inverted */
        if ( i + 1 == pSol[ABC_EXACT_SOL_NGATES] && Abc_LitIsCompl( *( p + 2 ) ) )
            for ( j = 0; j < 4; ++j )
                pGateTruth[j] = ( pGateTruth[j] == '0' ) ? '1' : '0';

        pSopCover = Abc_SopFromTruthBin( pGateTruth );
        pObj = Abc_NtkCreateNode( pNtk );
        assert( pObj );
        pObj->pData = Abc_SopRegister( (Mem_Flex_t*)pNtk->pManFunc, pSopCover );
        Vec_PtrPush( pGates, pObj );
        ABC_FREE( pSopCover );

        Abc_ObjAddFanin( pObj, (Abc_Obj_t *)Vec_PtrEntry( pGates, *p++ ) );
        Abc_ObjAddFanin( pObj, (Abc_Obj_t *)Vec_PtrEntry( pGates, *p++ ) );
    }

    /* output */
    pObj = (Abc_Obj_t *)Vec_PtrEntry( pGates, nVars + Abc_Lit2Var( *p ) );

    Vec_PtrFree( pGates );

    s_pSesStore->timeTotal += ( Abc_Clock() - timeStart );
    return pObj;
}